

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O0

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  char *pcVar7;
  int *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  gengetopt_args_info *in_R8;
  int found_prog_name;
  int i;
  int option_index;
  int optopt;
  int opterr;
  int optind;
  char *optarg;
  int check_ambiguity;
  int check_required;
  int initialize;
  int override;
  gengetopt_args_info local_args_info;
  int error_occurred;
  int c;
  char *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  gengetopt_args_info *in_stack_fffffffffffffe18;
  gengetopt_args_info *in_stack_fffffffffffffe20;
  gengetopt_args_info *local_1c0;
  int local_1a4;
  int local_19c;
  int local_198;
  int local_194;
  char *local_190;
  char **in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  uint *in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  char **in_stack_fffffffffffffee0;
  void *in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff00;
  cmdline_parser_arg_type in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  int local_40;
  
  local_40 = 0;
  package_name = (char *)*in_RSI;
  iVar5 = *in_RCX;
  iVar1 = in_RCX[2];
  iVar2 = in_RCX[3];
  if (in_RCX[1] != 0) {
    cmdline_parser_init((gengetopt_args_info *)0x12f96c);
  }
  cmdline_parser_init((gengetopt_args_info *)0x12f979);
  local_190 = (char *)0x0;
  local_194 = 0;
  local_198 = in_RCX[4];
  local_19c = 0x3f;
LAB_0012f9ad:
  do {
    custom_optarg = local_190;
    custom_optind = local_194;
    custom_opterr = local_198;
    custom_optopt = local_19c;
    uVar3 = custom_getopt_long(in_stack_fffffffffffffdf4,
                               (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ),
                               (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0)
                               ,(option *)in_stack_fffffffffffffdd8,(int *)0x12fa18);
    iVar4 = custom_optind;
    local_190 = custom_optarg;
    local_194 = custom_optind;
    local_198 = custom_opterr;
    local_19c = custom_optopt;
    if (uVar3 == 0xffffffff) {
      if (1 < *(int *)(in_RDX + 0x134)) {
        in_stack_fffffffffffffe20 = in_R8;
        if (in_R8 == (gengetopt_args_info *)0x0) {
          in_stack_fffffffffffffe20 = (gengetopt_args_info *)0x2f1097;
        }
        fprintf(_stderr,"%s: %d options of group input file were given. One is required%s.\n",
                *in_RSI,(ulong)*(uint *)(in_RDX + 0x134),in_stack_fffffffffffffe20);
        local_40 = 1;
      }
      if (iVar1 != 0) {
        iVar5 = cmdline_parser_required2
                          (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                           (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        local_40 = iVar5 + local_40;
      }
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      if (local_40 != 0) {
        return 1;
      }
      if (iVar4 < in_EDI) {
        local_1a4 = 0;
        *(int *)(in_RDX + 0x130) = in_EDI - iVar4;
        pvVar6 = malloc((ulong)*(uint *)(in_RDX + 0x130) << 3);
        *(void **)(in_RDX + 0x128) = pvVar6;
        while (local_194 < in_EDI) {
          local_194 = local_194 + 1;
          pcVar7 = gengetopt_strdup(in_stack_fffffffffffffdd8);
          *(char **)(*(long *)(in_RDX + 0x128) + (long)local_1a4 * 8) = pcVar7;
          local_1a4 = local_1a4 + 1;
        }
      }
      return 0;
    }
    if (uVar3 == 0) {
      iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"stl");
      if (iVar4 == 0) {
        if ((*(int *)(in_RDX + 0x134) != 0) && (iVar5 != 0)) {
          reset_group_input_file((gengetopt_args_info *)0x130101);
        }
        *(int *)(in_RDX + 0x134) = *(int *)(in_RDX + 0x134) + 1;
        in_stack_fffffffffffffdd8 = (char *)0x0;
        in_stack_fffffffffffffde0 = 2;
        in_stack_fffffffffffffe10 = 0x2d;
        in_stack_fffffffffffffde8 = iVar2;
        in_stack_fffffffffffffe18 = in_R8;
        iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff40);
      }
      else {
        iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"msms");
        if (iVar4 == 0) {
          if ((*(int *)(in_RDX + 0x134) != 0) && (iVar5 != 0)) {
            reset_group_input_file((gengetopt_args_info *)0x13021f);
          }
          *(int *)(in_RDX + 0x134) = *(int *)(in_RDX + 0x134) + 1;
          in_stack_fffffffffffffdd8 = (char *)0x0;
          in_stack_fffffffffffffde0 = 2;
          in_stack_fffffffffffffe10 = 0x2d;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else {
          iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"model");
          if (iVar4 != 0) goto LAB_0012f9ad;
          in_stack_fffffffffffffdd8 = (char *)0x0;
          in_stack_fffffffffffffde0 = 4;
          in_stack_fffffffffffffe10 = 0x2d;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
      }
    }
    else {
      if (uVar3 == 0x3f) goto LAB_0013062f;
      if (uVar3 == 0x56) {
        cmdline_parser_print_version();
        cmdline_parser_free((gengetopt_args_info *)0x12fb39);
        exit(0);
      }
      if (uVar3 == 0x65) {
        in_stack_fffffffffffffdd8 = (char *)0x0;
        in_stack_fffffffffffffde0 = 1;
        in_stack_fffffffffffffe10 = 0x65;
        in_stack_fffffffffffffde8 = iVar2;
        in_stack_fffffffffffffe18 = in_R8;
        iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff40);
      }
      else {
        if (uVar3 == 0x68) {
          cmdline_parser_print_help();
          cmdline_parser_free((gengetopt_args_info *)0x12fb20);
          exit(0);
        }
        if (uVar3 == 0x69) {
          if ((*(int *)(in_RDX + 0x134) != 0) && (iVar5 != 0)) {
            reset_group_input_file((gengetopt_args_info *)0x12fb68);
          }
          *(int *)(in_RDX + 0x134) = *(int *)(in_RDX + 0x134) + 1;
          in_stack_fffffffffffffdd8 = (char *)0x0;
          in_stack_fffffffffffffde0 = 2;
          in_stack_fffffffffffffe10 = 0x69;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else if (uVar3 == 0x6f) {
          in_stack_fffffffffffffdd8 = (char *)0x0;
          in_stack_fffffffffffffde0 = 2;
          in_stack_fffffffffffffe10 = 0x6f;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else if (uVar3 == 0x73) {
          in_stack_fffffffffffffdd8 = "0.2";
          in_stack_fffffffffffffde0 = 3;
          in_stack_fffffffffffffe10 = 0x73;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else if (uVar3 == 0x74) {
          in_stack_fffffffffffffdd8 = "300";
          in_stack_fffffffffffffde0 = 3;
          in_stack_fffffffffffffe10 = 0x74;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else if (uVar3 == 0x76) {
          in_stack_fffffffffffffdd8 = "0.01";
          in_stack_fffffffffffffde0 = 3;
          in_stack_fffffffffffffe10 = 0x76;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
        else {
          if (uVar3 != 0x78) {
            local_1c0 = in_R8;
            if (in_R8 == (gengetopt_args_info *)0x0) {
              local_1c0 = (gengetopt_args_info *)0x2f1097;
            }
            fprintf(_stderr,"%s: option unknown: %c%s\n","Hydro",(ulong)uVar3,local_1c0);
            abort();
          }
          if ((*(int *)(in_RDX + 0x134) != 0) && (iVar5 != 0)) {
            reset_group_input_file((gengetopt_args_info *)0x12fc58);
          }
          *(int *)(in_RDX + 0x134) = *(int *)(in_RDX + 0x134) + 1;
          in_stack_fffffffffffffdd8 = (char *)0x0;
          in_stack_fffffffffffffde0 = 2;
          in_stack_fffffffffffffe10 = 0x78;
          in_stack_fffffffffffffde8 = iVar2;
          in_stack_fffffffffffffe18 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                             in_stack_ffffffffffffff40);
        }
      }
    }
    if (iVar4 != 0) {
LAB_0013062f:
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      return 1;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "xyz",	1, NULL, 'x' },
        { "stl",	1, NULL, 0 },
        { "msms",	1, NULL, 0 },
        { "output",	1, NULL, 'o' },
        { "model",	1, NULL, 0 },
        { "beadSize",	1, NULL, 's' },
        { "elements",	0, NULL, 'e' },
        { "viscosity",	1, NULL, 'v' },
        { "temperature",	1, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:x:o:s:ev:t:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input MetaData (omd) file.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* xyz file for AtomicBead model.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->xyz_arg), 
               &(args_info->xyz_orig), &(args_info->xyz_given),
              &(local_args_info.xyz_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "xyz", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file prefix.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 's':	/* bead size (diameter) for RoughShell model (in angstroms).  */
        
        
          if (update_arg( (void *)&(args_info->beadSize_arg), 
               &(args_info->beadSize_orig), &(args_info->beadSize_given),
              &(local_args_info.beadSize_given), optarg, 0, "0.2", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "beadSize", 's',
              additional_error))
            goto failure;
        
          break;
        case 'e':	/* output the hydrodynamic elements (beads or triangles) only, hydrodynamics calculation will not be performed.  */
        
        
          if (update_arg((void *)&(args_info->elements_flag), 0, &(args_info->elements_given),
              &(local_args_info.elements_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "elements", 'e',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* viscosity (in poise).  */
        
        
          if (update_arg( (void *)&(args_info->viscosity_arg), 
               &(args_info->viscosity_orig), &(args_info->viscosity_given),
              &(local_args_info.viscosity_given), optarg, 0, "0.01", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "viscosity", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* temperature (in Kelvin.  */
        
        
          if (update_arg( (void *)&(args_info->temperature_arg), 
               &(args_info->temperature_orig), &(args_info->temperature_given),
              &(local_args_info.temperature_given), optarg, 0, "300", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "temperature", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* stl file for BoundaryElement model.  */
          if (strcmp (long_options[option_index].name, "stl") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->stl_arg), 
                 &(args_info->stl_orig), &(args_info->stl_given),
                &(local_args_info.stl_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "stl", '-',
                additional_error))
              goto failure;
          
          }
          /* filename root for MSMS .vert and .face files.  */
          else if (strcmp (long_options[option_index].name, "msms") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->msms_arg), 
                 &(args_info->msms_orig), &(args_info->msms_given),
                &(local_args_info.msms_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "msms", '-',
                additional_error))
              goto failure;
          
          }
          /* hydrodynamics model.  */
          else if (strcmp (long_options[option_index].name, "model") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->model_arg), 
                 &(args_info->model_orig), &(args_info->model_given),
                &(local_args_info.model_given), optarg, cmdline_parser_model_values, 0, ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "model", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->input_file_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group input file were given. One is required%s.\n", argv[0], args_info->input_file_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}